

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProtocolTCP.cpp
# Opt level: O0

uint16_t ProtocolTCP::ComputeChecksum
                   (uint8_t *packet,uint16_t length,uint8_t *sourceIP,uint8_t *targetIP)

{
  uint16_t uVar1;
  uint32_t uVar2;
  ushort local_2e;
  uint16_t tmp;
  uint32_t checksum;
  uint8_t *targetIP_local;
  uint8_t *sourceIP_local;
  uint16_t length_local;
  uint8_t *packet_local;
  
  uVar2 = FCS::ChecksumAdd(sourceIP,4,0);
  uVar2 = FCS::ChecksumAdd(targetIP,4,uVar2);
  local_2e = length;
  if ((length & 1) != 0) {
    local_2e = length + 1;
    packet[length] = '\0';
  }
  uVar2 = FCS::ChecksumAdd(packet,(uint)local_2e,(uint)length + uVar2 + 6);
  uVar1 = FCS::ChecksumComplete(uVar2);
  return uVar1;
}

Assistant:

uint16_t ProtocolTCP::ComputeChecksum(uint8_t* packet,
                                      uint16_t length,
                                      const uint8_t* sourceIP,
                                      const uint8_t* targetIP)
{
    uint32_t checksum;
    uint16_t tmp;

    // A whole lot o' hokum just to compute the checksum
    checksum = FCS::ChecksumAdd(sourceIP, 4, 0);
    checksum = FCS::ChecksumAdd(targetIP, 4, checksum);
    checksum += 0x06; // protocol
    checksum += length;
    if ((length & 0x0001) != 0)
    {
        // length is odd
        tmp = length + 1;
        packet[length] = 0;
    }
    else
    {
        tmp = length;
    }
    checksum = FCS::ChecksumAdd(packet, tmp, checksum);

    return FCS::ChecksumComplete(checksum);
}